

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O1

aiColor4D __thiscall
Assimp::AMFImporter::SPP_Material::GetColor
          (SPP_Material *this,float param_1,float param_2,float param_3)

{
  CAMFImporter_NodeElement_Color *pCVar1;
  undefined8 uVar2;
  runtime_error *prVar3;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Db;
  undefined8 uVar4;
  aiColor4D aVar5;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((this->Composition).
      super__List_base<Assimp::AMFImporter::SPP_Composite,_std::allocator<Assimp::AMFImporter::SPP_Composite>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->Composition) {
    prVar3 = (runtime_error *)
             __cxa_allocate_exception
                       (CONCAT44(in_XMM0_Db,param_1),CONCAT44(in_XMM1_Db,param_2),0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"IME. GetColor for composition","");
    std::runtime_error::runtime_error(prVar3,(string *)local_40);
    *(undefined ***)prVar3 = &PTR__runtime_error_00896c98;
    __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pCVar1 = this->Color;
  if (pCVar1->Composed == true) {
    prVar3 = (runtime_error *)
             __cxa_allocate_exception
                       (CONCAT44(in_XMM0_Db,param_1),CONCAT44(in_XMM1_Db,param_2),0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"IME. GetColor, composed color","");
    std::runtime_error::runtime_error(prVar3,(string *)local_40);
    *(undefined ***)prVar3 = &PTR__runtime_error_00896c98;
    __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2._0_4_ = (pCVar1->Color).r;
  uVar2._4_4_ = (pCVar1->Color).g;
  uVar4._0_4_ = (pCVar1->Color).b;
  uVar4._4_4_ = (pCVar1->Color).a;
  if (((float)(undefined4)uVar4 == 0.0 &&
      ((float)uVar2._4_4_ == 0.0 && (float)(undefined4)uVar2 == 0.0)) && (float)uVar4._4_4_ == 0.0)
  {
    uVar2 = 0x3f0000003f000000;
    uVar4 = 0x3f8000003f000000;
  }
  aVar5.b = (float)(int)uVar4;
  aVar5.a = (float)(int)((ulong)uVar4 >> 0x20);
  aVar5.r = (float)(int)uVar2;
  aVar5.g = (float)(int)((ulong)uVar2 >> 0x20);
  return aVar5;
}

Assistant:

aiColor4D AMFImporter::SPP_Material::GetColor(const float /*pX*/, const float /*pY*/, const float /*pZ*/) const
{
    aiColor4D tcol;

	// Check if stored data are supported.
	if(!Composition.empty())
	{
		throw DeadlyImportError("IME. GetColor for composition");
	}
	else if(Color->Composed)
	{
		throw DeadlyImportError("IME. GetColor, composed color");
	}
	else
	{
		tcol = Color->Color;
	}

	// Check if default color must be used
	if((tcol.r == 0) && (tcol.g == 0) && (tcol.b == 0) && (tcol.a == 0))
	{
		tcol.r = 0.5f;
		tcol.g = 0.5f;
		tcol.b = 0.5f;
		tcol.a = 1;
	}

	return tcol;
}